

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O2

void h265e_code_slice_header(H265eSlice *slice,MppWriteCtx *bitIf,RK_U32 slice_segment_addr)

{
  int iVar1;
  int iVar2;
  H265eReferencePictureSet *rps;
  RK_U8 RVar3;
  RK_S32 RVar4;
  SliceType SVar5;
  RK_S32 *pRVar6;
  H265ePps *pHVar7;
  int iVar8;
  H265eSps *pHVar9;
  int len;
  uint uVar10;
  ulong uVar11;
  RK_U32 *pRVar12;
  long lVar13;
  RK_U32 RVar14;
  RK_U32 RVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  RK_S32 local_b4;
  ulong local_a8;
  RK_U32 ltrpIndex;
  long local_80;
  RK_S32 ltrpInSPS [16];
  
  pHVar9 = slice->m_sps;
  uVar10 = pHVar9->m_maxCUSize;
  RVar15 = pHVar9->m_picWidthInLumaSamples;
  RVar14 = pHVar9->m_picHeightInLumaSamples;
  mpp_writer_put_bits(bitIf,(uint)(slice_segment_addr == 0),1);
  mpp_writer_put_ue(bitIf,slice->m_ppsId);
  if (slice_segment_addr != 0) {
    iVar8 = -1;
    do {
      iVar8 = iVar8 + 1;
    } while ((uint)(1 << ((byte)iVar8 & 0x1f)) <
             (((uVar10 - 1) + RVar14) / uVar10) * ((RVar15 + (uVar10 - 1)) / uVar10));
    mpp_writer_put_bits(bitIf,slice_segment_addr,iVar8);
  }
  rps = slice->m_rps;
  slice->m_enableTMVPFlag = 0;
  if (slice->m_dependentSliceSegmentFlag != 0) goto LAB_001c33b5;
  for (uVar10 = 0; uVar10 < (uint)slice->m_pps->m_numExtraSliceHeaderBits; uVar10 = uVar10 + 1) {
    mpp_writer_put_bits(bitIf,(uint)((slice->slice_reserved_flag >> (uVar10 & 0x1f) & 1) != 0),1);
  }
  mpp_writer_put_ue(bitIf,slice->m_sliceType);
  if (slice->m_pps->m_outputFlagPresentFlag != 0) {
    mpp_writer_put_bits(bitIf,(uint)(slice->m_picOutputFlag != 0),1);
  }
  pHVar9 = slice->m_sps;
  if (slice->m_sliceType != I_SLICE) {
    iVar8 = 1 << ((byte)pHVar9->m_bitsForPOC & 0x1f);
    mpp_writer_put_bits(bitIf,((slice->poc - slice->last_idr) + iVar8) % iVar8,pHVar9->m_bitsForPOC)
    ;
    if (slice->m_bdIdx < 0) {
      mpp_writer_put_bits(bitIf,0,1);
      code_st_refpic_set(bitIf,rps,(slice->m_sps->m_RPSList).m_numberOfReferencePictureSets);
    }
    else {
      mpp_writer_put_bits(bitIf,1,1);
      iVar8 = -1;
      do {
        iVar8 = iVar8 + 1;
      } while (1 << ((byte)iVar8 & 0x1f) < (slice->m_sps->m_RPSList).m_numberOfReferencePictureSets)
      ;
      if (iVar8 != 0) {
        mpp_writer_put_bits(bitIf,slice->m_bdIdx,iVar8);
      }
    }
    pHVar9 = slice->m_sps;
    if (pHVar9->m_bLongTermRefsPresent != 0) {
      lVar17 = (long)rps->m_numberOfPictures;
      RVar15 = rps->num_long_term_pic;
      lVar16 = lVar17 - (int)RVar15;
      local_a8 = 0;
      uVar10 = 0;
      do {
        pRVar12 = (RK_U32 *)(ltrpInSPS + (int)uVar10);
        lVar18 = 0;
LAB_001c35c0:
        if (lVar18 + lVar17 <= lVar16) {
          RVar14 = uVar10 - (int)lVar18;
          iVar8 = -1;
          do {
            iVar8 = iVar8 + 1;
          } while ((uint)(1 << ((byte)iVar8 & 0x1f)) < pHVar9->m_numLongTermRefPicSPS);
          if (pHVar9->m_numLongTermRefPicSPS != 0) {
            mpp_writer_put_ue(bitIf,RVar14);
          }
          mpp_writer_put_ue(bitIf,RVar15);
          iVar1 = rps->num_negative_pic;
          iVar2 = rps->num_positive_pic;
          lVar16 = (long)rps->m_numberOfPictures;
          local_80 = (ulong)uVar10 - lVar18;
          local_b4 = 0;
          do {
            lVar18 = 0x198;
            lVar17 = 0;
            do {
              lVar13 = lVar17;
              if (lVar16 + lVar13 <= (long)iVar2 + (long)iVar1) {
                pHVar9 = slice->m_sps;
                goto LAB_001c37c2;
              }
              if ((int)local_a8 < (int)RVar14) {
                pRVar6 = ltrpInSPS + local_a8;
                len = iVar8;
                if (iVar8 != 0) goto LAB_001c3710;
              }
              else {
                mpp_writer_put_bits(bitIf,rps->check_lt_msb[lVar16 + lVar13 + 0xf],
                                    slice->m_sps->m_bitsForPOC);
                pRVar6 = (RK_S32 *)((long)rps->m_refIdc + lVar18 + lVar16 * 4 + -0xc);
                len = 1;
LAB_001c3710:
                mpp_writer_put_bits(bitIf,*pRVar6,len);
              }
              mpp_writer_put_bits(bitIf,rps->m_deltaPOCMSBCycleLT[lVar16 + lVar13 + 0xf],1);
              lVar17 = lVar13 + -1;
              lVar18 = lVar18 + -4;
            } while (rps->m_deltaPOCMSBCycleLT[lVar16 + lVar13 + 0xf] == 0);
            if ((((int)local_80 + (int)lVar16) - rps->m_numberOfPictures) + (int)lVar17 == -1) {
              local_b4 = 0;
            }
            if (((int)lVar16 - rps->m_numberOfPictures) + (int)lVar17 == -1) {
              local_b4 = 0;
            }
            mpp_writer_put_ue(bitIf,rps->m_pocLSBLT[lVar16 + lVar13 + 0xf] - local_b4);
            local_b4 = rps->m_pocLSBLT[lVar16 + lVar13 + 0xf];
            lVar16 = lVar16 + lVar17;
          } while( true );
        }
        RVar3 = find_matching_ltrp(slice,&ltrpIndex,rps->m_ref[lVar17 + lVar18 + 0xf],
                                   rps->delta_poc[lVar17 + lVar18 + 0xf]);
        if (RVar3 != '\0') goto code_r0x001c35e3;
        local_a8 = (ulong)((int)local_a8 + 1);
        lVar17 = lVar17 + lVar18 + -1;
        uVar10 = uVar10 - (int)lVar18;
      } while( true );
    }
LAB_001c37c2:
    if (pHVar9->m_TMVPFlagsPresent != 0) {
      mpp_writer_put_bits(bitIf,(uint)(slice->m_enableTMVPFlag != 0),1);
      pHVar9 = slice->m_sps;
    }
  }
  if (pHVar9->m_bUseSAO != 0) {
    mpp_writer_put_bits(bitIf,0,1);
    mpp_writer_put_bits(bitIf,0,1);
  }
  if ((slice->m_sliceType != I_SLICE) &&
     (RVar15 = slice->m_numRefIdx[0], RVar14 = slice->m_pps->m_numRefIdxL0DefaultActive,
     mpp_writer_put_bits(bitIf,(uint)(RVar15 != RVar14),1), RVar15 != RVar14)) {
    mpp_writer_put_ue(bitIf,slice->m_numRefIdx[0] - 1);
    slice->m_numRefIdx[1] = 0;
  }
  if ((slice->m_pps->m_listsModificationPresentFlag != 0) &&
     (RVar4 = get_num_rps_cur_templist(rps), 1 < RVar4)) {
    iVar8 = 1;
    mpp_writer_put_bits(bitIf,(uint)((slice->m_RefPicListModification).
                                     m_refPicListModificationFlagL0 != 0),1);
    if (((slice->m_RefPicListModification).m_refPicListModificationFlagL0 != 0) &&
       (RVar4 = get_num_rps_cur_templist(rps), 1 < RVar4)) {
      for (uVar10 = RVar4 - 1; 1 < uVar10; uVar10 = uVar10 >> 1) {
        iVar8 = iVar8 + 1;
      }
      for (uVar11 = 0; uVar11 < (uint)slice->m_numRefIdx[0]; uVar11 = uVar11 + 1) {
        mpp_writer_put_bits(bitIf,(slice->m_RefPicListModification).m_RefPicSetIdxL0[uVar11],iVar8);
      }
    }
  }
  if (slice->m_pps->m_cabacInitPresentFlag != 0) {
    mpp_writer_put_bits(bitIf,slice->m_cabacInitFlag,1);
  }
  SVar5 = slice->m_sliceType;
  if (slice->m_enableTMVPFlag == 0) {
LAB_001c394c:
    if (SVar5 != I_SLICE) {
LAB_001c3951:
      RVar15 = 5 - slice->m_maxNumMergeCand;
      if (slice->m_maxNumMergeCand == 0) {
        RVar15 = 4;
      }
      mpp_writer_put_ue(bitIf,RVar15);
    }
  }
  else if (SVar5 != I_SLICE) {
    if (slice->m_colFromL0Flag == 0) {
      iVar8 = slice->m_numRefIdx[1];
joined_r0x001c3934:
      if (1 < iVar8) {
        mpp_writer_put_ue(bitIf,slice->m_colRefIdx);
        SVar5 = slice->m_sliceType;
        goto LAB_001c394c;
      }
    }
    else if (slice->m_colFromL0Flag == 1) {
      iVar8 = slice->m_numRefIdx[0];
      goto joined_r0x001c3934;
    }
    goto LAB_001c3951;
  }
  mpp_writer_put_se(bitIf,(slice->m_sliceQp - slice->m_pps->m_picInitQPMinus26) + -0x1a);
  pHVar7 = slice->m_pps;
  if (pHVar7->m_bSliceChromaQpFlag != 0) {
    mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCb);
    mpp_writer_put_se(bitIf,slice->m_sliceQpDeltaCr);
    pHVar7 = slice->m_pps;
  }
  if (pHVar7->m_deblockingFilterControlPresentFlag != 0) {
    if (pHVar7->m_deblockingFilterOverrideEnabledFlag != 0) {
      mpp_writer_put_bits(bitIf,slice->m_deblockingFilterOverrideFlag,1);
    }
    if ((slice->m_deblockingFilterOverrideFlag != 0) &&
       (mpp_writer_put_bits(bitIf,slice->m_deblockingFilterDisable,1),
       slice->m_deblockingFilterDisable == 0)) {
      mpp_writer_put_se(bitIf,slice->m_deblockingFilterBetaOffsetDiv2);
      mpp_writer_put_se(bitIf,slice->m_deblockingFilterTcOffsetDiv2);
    }
  }
LAB_001c33b5:
  pHVar7 = slice->m_pps;
  if (pHVar7->m_tiles_enabled_flag != 0) {
    mpp_writer_put_ue(bitIf,0);
    pHVar7 = slice->m_pps;
  }
  if (pHVar7->m_sliceHeaderExtensionPresentFlag != 0) {
    mpp_writer_put_ue(bitIf,slice->slice_header_extension_length);
    for (uVar10 = 0; uVar10 < slice->slice_header_extension_length; uVar10 = uVar10 + 1) {
      mpp_writer_put_bits(bitIf,0,8);
    }
  }
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_header");
  return;
code_r0x001c35e3:
  *pRVar12 = ltrpIndex;
  lVar18 = lVar18 + -1;
  pRVar12 = pRVar12 + 1;
  goto LAB_001c35c0;
}

Assistant:

void h265e_code_slice_header(H265eSlice *slice, MppWriteCtx *bitIf,
                             RK_U32 slice_segment_addr)
{
    RK_U32 i = 0;
    RK_U32 slice_address_addr_bits = 0;
    H265eSps *sps = slice->m_sps;
    RK_U32 pic_width_in_ctb = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) /
                              sps->m_maxCUSize;
    RK_U32 pic_height_in_ctb = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) /
                               sps->m_maxCUSize;
    RK_U32 max_ctu_num = pic_width_in_ctb * pic_height_in_ctb;

    mpp_writer_put_bits(bitIf, (slice_segment_addr == 0), 1); //first_slice_segment_in_pic_flag
    mpp_writer_put_ue(bitIf, slice->m_ppsId);

    if (slice_segment_addr != 0) {
        while (max_ctu_num > (RK_U32)(1 << slice_address_addr_bits)) {
            slice_address_addr_bits++;
        }
        //slice_segment_address
        mpp_writer_put_bits(bitIf, slice_segment_addr, slice_address_addr_bits);
    }

    H265eReferencePictureSet* rps = slice->m_rps;
    slice->m_enableTMVPFlag = 0;
    if (!slice->m_dependentSliceSegmentFlag) {
        for (i = 0; i < (RK_U32)slice->m_pps->m_numExtraSliceHeaderBits; i++) {
            mpp_writer_put_bits(bitIf, (slice->slice_reserved_flag >> i) & 0x1, 1);
        }

        mpp_writer_put_ue(bitIf, slice->m_sliceType);

        if (slice->m_pps->m_outputFlagPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_picOutputFlag ? 1 : 0, 1);
        }

        if (slice->m_sliceType != I_SLICE) { // skip frame can't iDR
            RK_S32 picOrderCntLSB = (slice->poc - slice->last_idr + (1 << slice->m_sps->m_bitsForPOC)) % (1 << slice->m_sps->m_bitsForPOC);
            mpp_writer_put_bits(bitIf, picOrderCntLSB, slice->m_sps->m_bitsForPOC);
            if (slice->m_bdIdx < 0) {
                mpp_writer_put_bits(bitIf, 0, 1);
                code_st_refpic_set(bitIf, rps, slice->m_sps->m_RPSList.m_numberOfReferencePictureSets);
            } else {
                mpp_writer_put_bits(bitIf, 1, 1);
                RK_S32 numBits = 0;
                while ((1 << numBits) < slice->m_sps->m_RPSList.m_numberOfReferencePictureSets) {
                    numBits++;
                }

                if (numBits > 0) {
                    mpp_writer_put_bits(bitIf, slice->m_bdIdx, numBits);
                }
            }
            if (slice->m_sps->m_bLongTermRefsPresent) {

                RK_S32 numLtrpInSH = rps->m_numberOfPictures;
                RK_S32 ltrpInSPS[MAX_REFS];
                RK_S32 numLtrpInSPS = 0;
                RK_U32 ltrpIndex;
                RK_S32 counter = 0;
                RK_S32 k;
                for (k = rps->m_numberOfPictures - 1; k > rps->m_numberOfPictures - rps->num_long_term_pic - 1; k--) {
                    if (find_matching_ltrp(slice, &ltrpIndex, rps->poc[k], rps->m_used[k])) {
                        ltrpInSPS[numLtrpInSPS] = ltrpIndex;
                        numLtrpInSPS++;
                    } else {
                        counter++;
                    }
                }

                numLtrpInSH -= rps->m_numberOfPictures - rps->num_long_term_pic;

                RK_S32 bitsForLtrpInSPS = 0;
                while (slice->m_sps->m_numLongTermRefPicSPS > (RK_U32)(1 << bitsForLtrpInSPS)) {
                    bitsForLtrpInSPS++;
                }

                if (slice->m_sps->m_numLongTermRefPicSPS > 0) {
                    mpp_writer_put_ue(bitIf, numLtrpInSPS);
                }
                mpp_writer_put_ue(bitIf, numLtrpInSH);
                // Note that the LSBs of the LT ref. pic. POCs must be sorted before.
                // Not sorted here because LT ref indices will be used in setRefPicList()
                RK_S32 prevDeltaMSB = 0;
                RK_S32 offset = rps->num_negative_pic + rps->num_positive_pic;
                for ( k = rps->m_numberOfPictures - 1; k > offset - 1; k--) {
                    if (counter < numLtrpInSPS) {
                        if (bitsForLtrpInSPS > 0) {
                            mpp_writer_put_bits(bitIf, ltrpInSPS[counter], bitsForLtrpInSPS);
                        }
                    } else {
                        mpp_writer_put_bits(bitIf, rps->m_pocLSBLT[k], slice->m_sps->m_bitsForPOC);
                        mpp_writer_put_bits(bitIf, rps->m_used[k], 1);
                    }
                    mpp_writer_put_bits(bitIf, rps->m_deltaPocMSBPresentFlag[k], 1);

                    if (rps->m_deltaPocMSBPresentFlag[k]) {
                        RK_U32 deltaFlag = 0;
                        if ((k == rps->m_numberOfPictures - 1) || (k == rps->m_numberOfPictures - 1 - numLtrpInSPS)) {
                            deltaFlag = 1;
                        }
                        if (deltaFlag) {
                            mpp_writer_put_ue(bitIf, rps->m_deltaPOCMSBCycleLT[k]);
                        } else {
                            RK_S32 differenceInDeltaMSB = rps->m_deltaPOCMSBCycleLT[k] - prevDeltaMSB;
                            mpp_writer_put_ue(bitIf, differenceInDeltaMSB);
                        }
                        prevDeltaMSB = rps->m_deltaPOCMSBCycleLT[k];
                    }
                }
            }
            if (slice->m_sps->m_TMVPFlagsPresent) {
                mpp_writer_put_bits(bitIf, slice->m_enableTMVPFlag ? 1 : 0, 1);
            }
        }

        if (slice->m_sps->m_bUseSAO) { //skip frame close sao
            mpp_writer_put_bits(bitIf, 0, 1);
            mpp_writer_put_bits(bitIf, 0, 1);

        }
        //check if numrefidxes match the defaults. If not, override

        if (slice->m_sliceType != I_SLICE) {
            RK_U32 overrideFlag = (slice->m_numRefIdx[0] != (RK_S32)slice->m_pps->m_numRefIdxL0DefaultActive);
            mpp_writer_put_bits(bitIf, overrideFlag ? 1 : 0, 1);
            if (overrideFlag) {
                mpp_writer_put_ue(bitIf, slice->m_numRefIdx[0] - 1);
                slice->m_numRefIdx[1] = 0;
            }
        }

        if (slice->m_pps->m_listsModificationPresentFlag && get_num_rps_cur_templist(rps) > 1) {
            H265eRefPicListModification* refPicListModification = &slice->m_RefPicListModification;
            mpp_writer_put_bits(bitIf, refPicListModification->m_refPicListModificationFlagL0 ? 1 : 0, 1);
            if (refPicListModification->m_refPicListModificationFlagL0) {
                RK_S32 numRpsCurrTempList0 = get_num_rps_cur_templist(rps);
                if (numRpsCurrTempList0 > 1) {
                    RK_S32 length = 1;
                    numRpsCurrTempList0--;
                    while (numRpsCurrTempList0 >>= 1) {
                        length++;
                    }
                    for (i = 0; i < (RK_U32)slice->m_numRefIdx[0]; i++) {
                        mpp_writer_put_bits(bitIf, refPicListModification->m_RefPicSetIdxL0[i], length);
                    }
                }
            }
        }

        if (slice->m_pps->m_cabacInitPresentFlag) {
            mpp_writer_put_bits(bitIf, slice->m_cabacInitFlag, 1);
        }

        if (slice->m_enableTMVPFlag) {

            if (slice->m_sliceType != I_SLICE &&
                ((slice->m_colFromL0Flag == 1 && slice->m_numRefIdx[0] > 1) ||
                 (slice->m_colFromL0Flag == 0 && slice->m_numRefIdx[1] > 1))) {
                mpp_writer_put_ue(bitIf, slice->m_colRefIdx);
            }
        }

        if (slice->m_sliceType != I_SLICE) {
            RK_S32 flag = MRG_MAX_NUM_CANDS - slice->m_maxNumMergeCand;
            flag = flag == 5 ? 4 : flag;
            mpp_writer_put_ue(bitIf, flag);
        }
        RK_S32 code = slice->m_sliceQp - (slice->m_pps->m_picInitQPMinus26 + 26);
        mpp_writer_put_se(bitIf, code);
        if (slice->m_pps->m_bSliceChromaQpFlag) {
            code = slice->m_sliceQpDeltaCb;
            mpp_writer_put_se(bitIf, code);
            code = slice->m_sliceQpDeltaCr;
            mpp_writer_put_se(bitIf, code);
        }
        if (slice->m_pps->m_deblockingFilterControlPresentFlag) {
            if (slice->m_pps->m_deblockingFilterOverrideEnabledFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterOverrideFlag, 1);
            }
            if (slice->m_deblockingFilterOverrideFlag) {
                mpp_writer_put_bits(bitIf, slice->m_deblockingFilterDisable, 1);
                if (!slice->m_deblockingFilterDisable) {
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterBetaOffsetDiv2);
                    mpp_writer_put_se(bitIf, slice->m_deblockingFilterTcOffsetDiv2);
                }
            }
        }
    }
    if (slice->m_pps->m_tiles_enabled_flag) {
        mpp_writer_put_ue(bitIf, 0);    // num_entry_point_offsets
    }
    if (slice->m_pps->m_sliceHeaderExtensionPresentFlag) {
        mpp_writer_put_ue(bitIf, slice->slice_header_extension_length);
        for (i = 0; i < slice->slice_header_extension_length; i++) {
            mpp_writer_put_bits(bitIf, 0, 8);
        }
    }
    h265e_dbg_func("leave\n");
}